

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O1

void __thiscall
poplar::
map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_fkhash_nlm<int,_16UL>_>
::show_stats(map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_fkhash_nlm<int,_16UL>_>
             *this,ostream *os,int n)

{
  ostream *poVar1;
  int n_00;
  undefined4 in_register_00000014;
  string indent;
  char local_59;
  long *local_58;
  long local_50;
  long local_48 [2];
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000014,n);
  local_58 = local_48;
  std::__cxx11::string::_M_construct((ulong)&local_58,(char)n * '\x04');
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"name",4);
  local_59 = ':';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_59,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"map",3);
  local_59 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_59,1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"lambda",6);
  local_59 = ':';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_59,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_59 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_59,1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"size",4);
  local_59 = ':';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_59,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_59 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_59,1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"alloc_bytes",0xb);
  local_59 = ':';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_59,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_59 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_59,1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"hash_trie_",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":\n",2);
  n_00 = (int)local_38 + 1;
  plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>::show_stats(&this->hash_trie_,os,n_00);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"label_store_",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":\n",2);
  compact_fkhash_nlm<int,_16UL>::show_stats(&this->label_store_,os,n_00);
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return;
}

Assistant:

void show_stats(std::ostream& os, int n = 0) const {
        auto indent = get_indent(n);
        show_stat(os, indent, "name", "map");
        show_stat(os, indent, "lambda", lambda_);
        show_stat(os, indent, "size", size());
        show_stat(os, indent, "alloc_bytes", alloc_bytes());
#ifdef POPLAR_EXTRA_STATS
        show_stat(os, indent, "rate_steps", rate_steps());
#endif
        show_member(os, indent, "hash_trie_");
        hash_trie_.show_stats(os, n + 1);
        show_member(os, indent, "label_store_");
        label_store_.show_stats(os, n + 1);
    }